

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otfcc-q2c.cpp
# Opt level: O1

string * GetName(string *__return_storage_ptr__,NameId id,json *name)

{
  bool bVar1;
  bool bVar2;
  reference this;
  const_reference pvVar3;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator local_70;
  const_iterator local_50;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cbegin(&local_50,name);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::cend(&local_70,name);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_50,&local_70);
  if (!bVar1) {
    do {
      this = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*(&local_50);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)this,"nameID");
      bVar2 = nlohmann::operator==<NameId,_0>(pvVar3,id);
      if (bVar2) {
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)this,"platformID");
        bVar2 = nlohmann::operator==<int,_0>(pvVar3,3);
        if (bVar2) {
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)this,"encodingID");
          bVar2 = nlohmann::operator==<int,_0>(pvVar3,1);
          if (!bVar2) {
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)this,"encodingID");
            bVar2 = nlohmann::operator==<int,_0>(pvVar3,10);
            if (!bVar2) goto LAB_001038b2;
          }
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)this,"languageID");
          bVar2 = nlohmann::operator==<int,_0>(pvVar3,0x409);
          if (bVar2) {
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)this,"nameString");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (__return_storage_ptr__,pvVar3);
            if (bVar1 == false) {
              return __return_storage_ptr__;
            }
            break;
          }
        }
      }
LAB_001038b2:
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_50);
      bVar1 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_50,&local_70);
    } while (!bVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string GetName(NameId id, const json &name)
{
	for (const json &entry : name)
	{
		// Windows, Unicode, English
		if (entry["nameID"] == id && entry["platformID"] == 3 &&
		    (entry["encodingID"] == 1 || entry["encodingID"] == 10) &&
		    entry["languageID"] == 1033)
			return entry["nameString"];
	}
	return {};
}